

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_padding.cpp
# Opt level: O3

void test_2d_static<0ul,0ul,30ul,1ul>(void)

{
  int i_1;
  int i;
  unsigned_long *puVar1;
  int i_2;
  unsigned_long *puVar2;
  size_t true_idx;
  int dptr [30];
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  int *local_b0;
  unsigned_long local_a8 [15];
  
  local_a8[0]._0_1_ = true;
  local_b8._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(bool *)local_a8,
             (bool *)&local_b8);
  puVar1 = (unsigned_long *)0x0;
  local_a8[0]._0_1_ = false;
  local_b8._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(bool *)local_a8,
             (bool *)&local_b8);
  local_a8[0] = (ulong)local_a8[0]._1_7_ << 8;
  local_b8 = (unsigned_long *)((ulong)local_b8._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(bool *)local_a8,
             (bool *)&local_b8);
  local_a8[0] = 1;
  local_b8 = (unsigned_long *)CONCAT44(local_b8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",local_a8,
             (int *)&local_b8);
  local_a8[0] = 0x1e;
  local_b8 = (unsigned_long *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","N + X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x24,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",local_a8,
             (unsigned_long *)&local_b8);
  local_a8[0] = 0x1e;
  local_b8 = (unsigned_long *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x26,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",local_a8,
             (unsigned_long *)&local_b8);
  local_a8[0] = 0x1e;
  local_b8 = (unsigned_long *)0x1e;
  puVar2 = local_a8;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
             ,0x27,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",puVar2,
             (unsigned_long *)&local_b8);
  do {
    local_c0 = puVar1;
    local_b8 = puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x31,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    local_b0 = (int *)((long)local_a8 + (long)local_b8 * 4);
    local_c0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_c0
               ,&local_b0);
    *(undefined4 *)puVar2 = 0x2a;
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x37,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(int *)puVar2,
               (int *)&local_c0);
    puVar1 = (unsigned_long *)((long)puVar1 + 1);
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  } while (puVar1 != (unsigned_long *)0x1e);
  puVar2 = local_a8;
  puVar1 = (unsigned_long *)0x0;
  do {
    local_c0 = puVar1;
    local_b8 = puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x40,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    local_b0 = (int *)((long)local_a8 + (long)local_b8 * 4);
    local_c0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x42,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_c0
               ,&local_b0);
    puVar1 = (unsigned_long *)((long)puVar1 + 1);
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  } while (puVar1 != (unsigned_long *)0x1e);
  puVar2 = local_a8;
  puVar1 = (unsigned_long *)0x0;
  do {
    local_c0 = puVar1;
    local_b8 = puVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x5b,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    local_b0 = (int *)((long)local_a8 + (long)local_b8 * 4);
    local_c0 = puVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x5d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(int **)&local_c0
               ,&local_b0);
    local_c0 = (unsigned_long *)CONCAT44(local_c0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_padding.cpp"
               ,0x6e,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 1UL]",(int *)puVar2,
               (int *)&local_c0);
    puVar1 = (unsigned_long *)((long)puVar1 + 1);
    puVar2 = (unsigned_long *)((long)puVar2 + 4);
  } while (puVar1 != (unsigned_long *)0x1e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.stride(1)), N + X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l.pads()[0] + l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}